

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O0

void __thiscall GmmLib::GmmPageTableMgr::~GmmPageTableMgr(GmmPageTableMgr *this)

{
  Table *pTVar1;
  AuxTable *this_00;
  GMM_DEVICE_CALLBACKS_INT *in_RSI;
  GMM_CLIENT ClientType;
  GmmPageTableMgr *this_local;
  
  this->_vptr_GmmPageTableMgr = (_func_int **)&PTR_GetAuxL3TableAddr_002c0be0;
  if (this->pClientContext != (GmmClientContext *)0x0) {
    (*this->pClientContext->_vptr_GmmClientContext[2])();
  }
  if (this->pPool != (GMM_PAGETABLEPool *)0x0) {
    if (this->AuxTTObj != (AuxTable *)0x0) {
      EnterCriticalSection(&this->PoolLock);
    }
    in_RSI = &this->DeviceCbInt;
    GmmPageTablePool::__DestroyPageTablePool(this->pPool,in_RSI,this->hCsr);
    this->NumNodePoolElements = 0;
    if (this->AuxTTObj != (AuxTable *)0x0) {
      LeaveCriticalSection(&this->PoolLock);
    }
  }
  if ((this->AuxTTObj != (AuxTable *)0x0) &&
     (DeleteCriticalSection(&this->PoolLock), this->AuxTTObj != (AuxTable *)0x0)) {
    if ((this->AuxTTObj->NullL1Table != (Table *)0x0) &&
       (pTVar1 = this->AuxTTObj->NullL1Table, pTVar1 != (Table *)0x0)) {
      operator_delete(pTVar1);
    }
    if ((this->AuxTTObj->NullL2Table != (Table *)0x0) &&
       (pTVar1 = this->AuxTTObj->NullL2Table, pTVar1 != (Table *)0x0)) {
      operator_delete(pTVar1);
    }
    PageTable::DestroyL3Table(&this->AuxTTObj->super_PageTable);
    this_00 = this->AuxTTObj;
    if (this_00 != (AuxTable *)0x0) {
      AuxTable::~AuxTable(this_00);
      GmmMemAllocator::operator_delete((GmmMemAllocator *)this_00,in_RSI);
    }
    this->AuxTTObj = (AuxTable *)0x0;
  }
  return;
}

Assistant:

GmmLib::GmmPageTableMgr::~GmmPageTableMgr()
{
    GMM_CLIENT ClientType;

    GET_GMM_CLIENT_TYPE(pClientContext, ClientType);



    if(pPool)
    {
        ENTER_CRITICAL_SECTION
        pPool->__DestroyPageTablePool(&DeviceCbInt, hCsr);
        NumNodePoolElements = 0;
        EXIT_CRITICAL_SECTION
    }

    if(AuxTTObj)
    {
        DeleteCriticalSection(&PoolLock);

        if(AuxTTObj)
        {
            if(AuxTTObj->NullL1Table)
            {
                delete AuxTTObj->NullL1Table;
            }
            if(AuxTTObj->NullL2Table)
            {
                delete AuxTTObj->NullL2Table;
            }
            AuxTTObj->DestroyL3Table();
            delete AuxTTObj;
            AuxTTObj = NULL;
        }
    }
}